

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O1

idx_t duckdb::ColumnSegment::FilterSelection
                (SelectionVector *sel,Vector *vector,UnifiedVectorFormat *vdata,TableFilter *filter,
                TableFilterState *filter_state,idx_t scan_count,idx_t *approved_tuple_count)

{
  PhysicalType PVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer puVar6;
  pointer __src;
  double predicate_00;
  long lVar7;
  bool predicate_01;
  int8_t predicate_02;
  uint8_t predicate_03;
  int16_t predicate_04;
  uint16_t predicate_05;
  int32_t predicate_06;
  uint32_t predicate_07;
  ConstantFilter *pCVar8;
  ConjunctionAndFilter *pCVar9;
  const_reference pvVar10;
  reference pvVar11;
  type pTVar12;
  StructFilter *pSVar13;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  pointer this_01;
  type vector_00;
  type pTVar14;
  ConjunctionOrFilter *pCVar15;
  uint64_t predicate_08;
  int64_t predicate_09;
  string *psVar16;
  InternalException *pIVar17;
  InvalidTypeException *this_02;
  idx_t iVar18;
  element_type *peVar19;
  shared_ptr<duckdb::SelectionData,_true> *other;
  idx_t iVar20;
  idx_t iVar21;
  ulong uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  idx_t iVar24;
  ulong uVar25;
  idx_t iVar26;
  ulong uVar27;
  size_type sVar28;
  sel_t *psVar29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  idx_t iVar32;
  float predicate_10;
  hugeint_t hVar33;
  uhugeint_t uVar34;
  hugeint_t predicate_11;
  uhugeint_t predicate_12;
  string_t predicate_13;
  SelectionVector current_result_sel;
  string_t predicate;
  idx_t chunk_end;
  SelectionVector result_sel_1;
  SelectionVector current_sel;
  ExpressionType in_stack_fffffffffffffef8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  buffer_ptr<SelectionData> *local_f8;
  SelectionVector *local_f0;
  ExpressionExecutor *local_e8;
  Vector *local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  undefined1 local_a8 [72];
  shared_ptr<duckdb::SelectionData,_true> local_60;
  UnifiedVectorFormat *local_50;
  SelectionVector local_48;
  
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
    pCVar8 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    PVar1 = (vector->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
        predicate_01 = BooleanValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<bool>
                  (vdata,predicate_01,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case UINT8:
        predicate_03 = UTinyIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<unsigned_char>
                  (vdata,predicate_03,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case INT8:
        predicate_02 = TinyIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<signed_char>
                  (vdata,predicate_02,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case UINT16:
        predicate_05 = USmallIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<unsigned_short>
                  (vdata,predicate_05,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case INT16:
        predicate_04 = SmallIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<short>
                  (vdata,predicate_04,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case UINT32:
        predicate_07 = UIntegerValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<unsigned_int>
                  (vdata,predicate_07,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case INT32:
        predicate_06 = IntegerValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<int>
                  (vdata,predicate_06,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case UINT64:
        predicate_08 = UBigIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<unsigned_long>
                  (vdata,predicate_08,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case INT64:
        predicate_09 = BigIntValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<long>
                  (vdata,predicate_09,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      default:
switchD_006084c5_caseD_a:
        this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        local_b8._0_8_ = local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Invalid type for filter pushed down to table comparison","");
        InvalidTypeException::InvalidTypeException(this_02,&vector->type,(string *)local_b8);
        __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        predicate_10 = FloatValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<float>
                  (vdata,predicate_10,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
        break;
      case DOUBLE:
        predicate_00 = DoubleValue::Get(&pCVar8->constant);
        FilterSelectionSwitch<double>
                  (vdata,predicate_00,sel,approved_tuple_count,(pCVar8->super_TableFilter).field_0x9
                  );
      }
    }
    else if (PVar1 == VARCHAR) {
      psVar16 = StringValue::Get_abi_cxx11_(&pCVar8->constant);
      __src = (psVar16->_M_dataplus)._M_p;
      local_b8._0_4_ = (undefined4)psVar16->_M_string_length;
      if ((uint)local_b8._0_4_ < 0xd) {
        uStack_ac = 0;
        local_b8._4_4_ = 0;
        local_b8._8_4_ = 0;
        if (local_b8._0_4_ != 0) {
          switchD_00b1522a::default(local_b8 + 4,__src,(ulong)(local_b8._0_4_ & 0xf));
        }
      }
      else {
        local_b8._4_4_ = *(undefined4 *)__src;
        local_b8._8_4_ = SUB84(__src,0);
        uStack_ac = (undefined4)((ulong)__src >> 0x20);
      }
      predicate_13.value._4_1_ = (undefined1)uStack_ac;
      predicate_13.value._5_1_ = uStack_ac._1_1_;
      predicate_13.value._6_1_ = uStack_ac._2_1_;
      predicate_13.value._7_1_ = uStack_ac._3_1_;
      predicate_13.value.pointer.length = local_b8._8_4_;
      predicate_13.value.pointer.ptr = (char *)sel;
      FilterSelectionSwitch<duckdb::string_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)CONCAT44(local_b8._4_4_,local_b8._0_4_),
                 predicate_13,(SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar8->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffef8);
    }
    else if (PVar1 == UINT128) {
      uVar34 = UhugeIntValue::Get(&pCVar8->constant);
      predicate_12.lower = uVar34.upper;
      predicate_12.upper = (uint64_t)sel;
      FilterSelectionSwitch<duckdb::uhugeint_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)uVar34.lower,predicate_12,
                 (SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar8->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffef8);
    }
    else {
      if (PVar1 != INT128) goto switchD_006084c5_caseD_a;
      hVar33 = HugeIntValue::Get(&pCVar8->constant);
      predicate_11.lower = hVar33.upper;
      predicate_11.upper = (int64_t)sel;
      FilterSelectionSwitch<duckdb::hugeint_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)hVar33.lower,predicate_11,
                 (SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar8->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffef8);
    }
    return *approved_tuple_count;
  case IS_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      *approved_tuple_count = 0;
      return 0;
    }
    SelectionVector::SelectionVector((SelectionVector *)local_b8,*approved_tuple_count);
    uVar2 = *approved_tuple_count;
    if (uVar2 == 0) {
LAB_00608a9c:
      iVar32 = 0;
    }
    else {
      psVar29 = sel->sel_vector;
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar4 = vdata->sel->sel_vector;
      iVar32 = 0;
      uVar22 = 0;
      do {
        uVar25 = uVar22;
        if (psVar29 != (sel_t *)0x0) {
          uVar25 = (ulong)psVar29[uVar22];
        }
        uVar27 = uVar25;
        if (psVar4 != (sel_t *)0x0) {
          uVar27 = (ulong)psVar4[uVar25];
        }
        if ((puVar3 != (unsigned_long *)0x0) && ((puVar3[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) == 0))
        {
          *(int *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + iVar32 * 4) = (int)uVar25;
          iVar32 = iVar32 + 1;
        }
        uVar22 = uVar22 + 1;
      } while (uVar2 != uVar22);
    }
    break;
  case IS_NOT_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) goto LAB_006086bd;
    SelectionVector::SelectionVector((SelectionVector *)local_b8,*approved_tuple_count);
    uVar2 = *approved_tuple_count;
    if (uVar2 == 0) goto LAB_00608a9c;
    psVar29 = sel->sel_vector;
    puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar4 = vdata->sel->sel_vector;
    iVar32 = 0;
    uVar22 = 0;
    do {
      uVar25 = uVar22;
      if (psVar29 != (sel_t *)0x0) {
        uVar25 = (ulong)psVar29[uVar22];
      }
      uVar27 = uVar25;
      if (psVar4 != (sel_t *)0x0) {
        uVar27 = (ulong)psVar4[uVar25];
      }
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0)) {
        *(int *)(CONCAT44(local_b8._4_4_,local_b8._0_4_) + iVar32 * 4) = (int)uVar25;
        iVar32 = iVar32 + 1;
      }
      uVar22 = uVar22 + 1;
    } while (uVar2 != uVar22);
    break;
  case CONJUNCTION_OR:
    SelectionVector::SelectionVector((SelectionVector *)local_b8,*approved_tuple_count);
    pCVar15 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    if ((pCVar15->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pCVar15->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_00608a9c;
    local_f0 = (SelectionVector *)&(pCVar15->super_ConjunctionFilter).child_filters;
    local_f8 = &sel->selection_data;
    local_e8 = (ExpressionExecutor *)(filter_state + 1);
    iVar32 = 0;
    sVar28 = 0;
    local_e0 = vector;
    local_50 = vdata;
    do {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                              *)local_f0,sVar28);
      pTVar14 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(pvVar10);
      local_d8._0_8_ = (sel_t *)0x0;
      local_d8._8_8_ = (element_type *)0x0;
      aStack_c8._M_allocated_capacity = 0;
      shared_ptr<duckdb::SelectionData,_true>::operator=
                ((shared_ptr<duckdb::SelectionData,_true> *)(local_d8 + 8),local_f8);
      local_d8._0_8_ = sel->sel_vector;
      local_a8._64_8_ = *approved_tuple_count;
      pvVar11 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                              *)local_e8,sVar28);
      pTVar12 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                ::operator*(pvVar11);
      iVar18 = FilterSelection((SelectionVector *)local_d8,local_e0,local_50,pTVar14,pTVar12,
                               scan_count,(idx_t *)(local_a8 + 0x40));
      if (iVar18 != 0) {
        lVar7 = CONCAT44(local_b8._4_4_,local_b8._0_4_);
        iVar20 = 0;
        do {
          iVar21 = iVar20;
          if ((sel_t *)local_d8._0_8_ != (sel_t *)0x0) {
            iVar21 = (idx_t)*(uint *)(local_d8._0_8_ + iVar20 * 4);
          }
          if (iVar32 != 0) {
            iVar24 = 0;
            do {
              iVar26 = iVar24;
              if (lVar7 != 0) {
                iVar26 = (idx_t)*(uint *)(lVar7 + iVar24 * 4);
              }
              if (iVar26 == iVar21) goto LAB_006089dc;
              iVar24 = iVar24 + 1;
            } while (iVar32 != iVar24);
          }
          *(int *)(lVar7 + iVar32 * 4) = (int)iVar21;
          iVar32 = iVar32 + 1;
LAB_006089dc:
          iVar20 = iVar20 + 1;
        } while (iVar20 != iVar18);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_c8._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_c8._M_allocated_capacity);
      }
      sVar28 = sVar28 + 1;
    } while (sVar28 < (ulong)((long)(pCVar15->super_ConjunctionFilter).child_filters.
                                    super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pCVar15->super_ConjunctionFilter).child_filters.
                                    super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    break;
  case CONJUNCTION_AND:
    pCVar9 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    if ((pCVar9->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar9->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar28 = 0;
      local_f0 = sel;
      local_e8 = (ExpressionExecutor *)scan_count;
      local_e0 = vector;
      do {
        pvVar10 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                  ::operator[](&(pCVar9->super_ConjunctionFilter).child_filters,sVar28);
        pTVar14 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(pvVar10);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                                *)(filter_state + 1),sVar28);
        pTVar12 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                  ::operator*(pvVar11);
        FilterSelection(local_f0,local_e0,vdata,pTVar14,pTVar12,(idx_t)local_e8,approved_tuple_count
                       );
        sVar28 = sVar28 + 1;
      } while (sVar28 < (ulong)((long)(pCVar9->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar9->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_006086bd:
    return *approved_tuple_count;
  case STRUCT_EXTRACT:
    pSVar13 = TableFilter::Cast<duckdb::StructFilter>(filter);
    this = StructVector::GetEntries(vector);
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::operator[](this,pSVar13->child_idx);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
    this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (this_00);
    Vector::ToUnifiedFormat(this_01,scan_count,(UnifiedVectorFormat *)local_b8);
    vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
    pTVar14 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pSVar13->child_filter);
    iVar32 = FilterSelection(sel,vector_00,(UnifiedVectorFormat *)local_b8,pTVar14,filter_state,
                             scan_count,approved_tuple_count);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._48_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._48_8_);
    }
    goto LAB_00608b74;
  case OPTIONAL_FILTER:
    return scan_count;
  default:
    pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"FIXME: unsupported type for filter selection","");
    InternalException::InternalException(pIVar17,(string *)local_b8);
    __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPRESSION_FILTER:
    SelectionVector::SelectionVector((SelectionVector *)(local_a8 + 0x40),*approved_tuple_count);
    if (scan_count < 0x801) {
      DataChunk::DataChunk((DataChunk *)local_b8);
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)local_b8,vector);
      local_a8._8_8_ = scan_count;
      iVar32 = ExpressionExecutor::SelectExpression
                         ((ExpressionExecutor *)(filter_state + 1),(DataChunk *)local_b8,
                          (SelectionVector *)(local_a8 + 0x40),
                          (optional_ptr<duckdb::SelectionVector,_true>)sel,*approved_tuple_count);
      *approved_tuple_count = iVar32;
      DataChunk::~DataChunk((DataChunk *)local_b8);
    }
    else {
      local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      SelectionVector::SelectionVector(&local_48,*approved_tuple_count);
      if (local_100 < scan_count) {
        local_e8 = (ExpressionExecutor *)(filter_state + 1);
        local_f8 = (buffer_ptr<SelectionData> *)0x0;
        p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f0 = sel;
        local_e0 = vector;
        do {
          peVar19 = (element_type *)(scan_count - (long)local_100);
          if ((element_type *)0x7ff < peVar19) {
            peVar19 = (element_type *)0x800;
          }
          local_a8._56_8_ =
               (long)&(peVar19->owned_data).
                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false> +
               (long)&local_100->_vptr__Sp_counted_base;
          DataChunk::DataChunk((DataChunk *)local_b8);
          ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
          emplace_back<duckdb::Vector&,unsigned_long&,unsigned_long&>
                    ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)local_b8,local_e0,
                     (unsigned_long *)&local_100,(unsigned_long *)(local_a8 + 0x38));
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*approved_tuple_count;
          local_a8._8_8_ = peVar19;
          if (p_Var30 < p_Var5) {
            puVar6 = (((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                        *)&local_f0->sel_vector)->
                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar32 = 0;
            do {
              p_Var23 = p_Var30;
              if (puVar6 != (pointer)0x0) {
                p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (ulong)*(uint *)((long)&(puVar6->
                                                  super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                                                  )._M_t + (long)p_Var30 * 4);
              }
              if (p_Var23 < (ulong)local_a8._56_8_) {
                if (p_Var23 < local_100) {
                  pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
                  local_d8._0_8_ = &aStack_c8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_d8,"sel_index < offset in expression filter","");
                  InternalException::InternalException(pIVar17,(string *)local_d8);
                  __cxa_throw(pIVar17,&InternalException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                *(int *)((long)(_func_int ***)local_48.sel_vector + iVar32 * 4) =
                     (int)p_Var23 - (int)local_100;
                iVar32 = iVar32 + 1;
              }
              p_Var31 = p_Var30;
            } while ((p_Var23 < (ulong)local_a8._56_8_) &&
                    (p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)&p_Var30->_vptr__Sp_counted_base + 1), p_Var31 = p_Var5,
                    p_Var5 != p_Var30));
          }
          else {
            iVar32 = 0;
            p_Var31 = p_Var30;
          }
          if (iVar32 == 0) {
            local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(peVar19->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false> +
                        (long)&local_100->_vptr__Sp_counted_base);
          }
          else {
            psVar29 = (sel_t *)((long)&((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
                                         *)local_a8._64_8_)->_M_t + (long)local_f8 * 4);
            aStack_c8._M_allocated_capacity = 0;
            local_d8._8_8_ = (element_type *)0x0;
            local_d8._0_8_ = psVar29;
            iVar32 = ExpressionExecutor::SelectExpression
                               (local_e8,(DataChunk *)local_b8,(SelectionVector *)local_d8,&local_48
                                ,iVar32);
            if (iVar32 != 0) {
              iVar18 = 0;
              do {
                psVar4 = psVar29 + iVar18;
                *psVar4 = *psVar4 + (int)local_100;
                iVar18 = iVar18 + 1;
              } while (iVar32 != iVar18);
            }
            local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(peVar19->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false> +
                        (long)&local_100->_vptr__Sp_counted_base);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_c8._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         aStack_c8._M_allocated_capacity);
            }
            local_f8 = (buffer_ptr<SelectionData> *)
                       ((long)&(local_f8->internal).
                               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + iVar32);
          }
          DataChunk::~DataChunk((DataChunk *)local_b8);
          p_Var30 = p_Var31;
        } while (local_100 < scan_count);
      }
      else {
        local_f8 = (buffer_ptr<SelectionData> *)0x0;
        local_f0 = sel;
      }
      *approved_tuple_count = (idx_t)local_f8;
      sel = local_f0;
      if (local_48.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
        sel = local_f0;
      }
    }
    other = &local_60;
    shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,other);
    (((vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
       *)&sel->sel_vector)->
    super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._64_8_;
    iVar32 = *approved_tuple_count;
    goto LAB_00608b70;
  }
  other = (shared_ptr<duckdb::SelectionData,_true> *)(local_b8 + 8);
  shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,other);
  sel->sel_vector = (sel_t *)CONCAT44(local_b8._4_4_,local_b8._0_4_);
  *approved_tuple_count = iVar32;
LAB_00608b70:
  local_a8._16_8_ =
       (other->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
LAB_00608b74:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._16_8_);
  }
  return iVar32;
}

Assistant:

idx_t ColumnSegment::FilterSelection(SelectionVector &sel, Vector &vector, UnifiedVectorFormat &vdata,
                                     const TableFilter &filter, TableFilterState &filter_state, idx_t scan_count,
                                     idx_t &approved_tuple_count) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER: {
		return scan_count;
	}
	case TableFilterType::CONJUNCTION_OR: {
		// similar to the CONJUNCTION_AND, but we need to take care of the SelectionVectors (OR all of them)
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		idx_t count_total = 0;
		SelectionVector result_sel(approved_tuple_count);
		auto &conjunction_or = filter.Cast<ConjunctionOrFilter>();
		for (idx_t child_idx = 0; child_idx < conjunction_or.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_or.child_filters[child_idx];
			SelectionVector temp_sel;
			temp_sel.Initialize(sel);
			idx_t temp_tuple_count = approved_tuple_count;
			idx_t temp_count = FilterSelection(temp_sel, vector, vdata, child_filter, *state.child_states[child_idx],
			                                   scan_count, temp_tuple_count);
			// tuples passed, move them into the actual result vector
			for (idx_t i = 0; i < temp_count; i++) {
				auto new_idx = temp_sel.get_index(i);
				bool is_new_idx = true;
				for (idx_t res_idx = 0; res_idx < count_total; res_idx++) {
					if (result_sel.get_index(res_idx) == new_idx) {
						is_new_idx = false;
						break;
					}
				}
				if (is_new_idx) {
					result_sel.set_index(count_total++, new_idx);
				}
			}
		}
		sel.Initialize(result_sel);
		approved_tuple_count = count_total;
		return approved_tuple_count;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction_and.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_and.child_filters[child_idx];
			FilterSelection(sel, vector, vdata, child_filter, *state.child_states[child_idx], scan_count,
			                approved_tuple_count);
		}
		return approved_tuple_count;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		switch (vector.GetType().InternalType()) {
		case PhysicalType::UINT8: {
			auto predicate = UTinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint8_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT16: {
			auto predicate = USmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint16_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT32: {
			auto predicate = UIntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint32_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT64: {
			auto predicate = UBigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint64_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT8: {
			auto predicate = TinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int8_t>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT16: {
			auto predicate = SmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int16_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT32: {
			auto predicate = IntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int32_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT64: {
			auto predicate = BigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int64_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT128: {
			auto predicate = HugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<hugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                 constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT128: {
			auto predicate = UhugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uhugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                  constant_filter.comparison_type);
			break;
		}
		case PhysicalType::FLOAT: {
			auto predicate = FloatValue::Get(constant_filter.constant);
			FilterSelectionSwitch<float>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::DOUBLE: {
			auto predicate = DoubleValue::Get(constant_filter.constant);
			FilterSelectionSwitch<double>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::VARCHAR: {
			auto predicate = string_t(StringValue::Get(constant_filter.constant));
			FilterSelectionSwitch<string_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::BOOL: {
			auto predicate = BooleanValue::Get(constant_filter.constant);
			FilterSelectionSwitch<bool>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		default:
			throw InvalidTypeException(vector.GetType(), "Invalid type for filter pushed down to table comparison");
		}
		return approved_tuple_count;
	}
	case TableFilterType::IS_NULL: {
		return TemplatedNullSelection<true>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::IS_NOT_NULL: {
		return TemplatedNullSelection<false>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		// Apply the filter on the child vector
		auto &child_vec = StructVector::GetEntries(vector)[struct_filter.child_idx];
		UnifiedVectorFormat child_data;
		child_vec->ToUnifiedFormat(scan_count, child_data);
		return FilterSelection(sel, *child_vec, child_data, *struct_filter.child_filter, filter_state, scan_count,
		                       approved_tuple_count);
	}
	case TableFilterType::EXPRESSION_FILTER: {
		auto &state = filter_state.Cast<ExpressionFilterState>();
		SelectionVector result_sel(approved_tuple_count);
		if (scan_count > STANDARD_VECTOR_SIZE) {
			// scan count is > vector size - split up the vector into multiple chunks
			idx_t offset = 0;
			idx_t result_offset = 0;
			idx_t current_sel_offset = 0;
			SelectionVector current_sel(approved_tuple_count);
			while (offset < scan_count) {
				idx_t chunk_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, scan_count - offset);
				idx_t chunk_end = offset + chunk_count;
				DataChunk chunk;
				chunk.data.emplace_back(vector, offset, chunk_end);
				chunk.SetCardinality(chunk_count);

				// construct the relevant selection vector for the current chunk (offset ... offset + chunk_count)
				idx_t current_count = 0;
				for (; current_sel_offset < approved_tuple_count; current_sel_offset++) {
					auto sel_index = sel.get_index(current_sel_offset);
					if (sel_index >= chunk_end) {
						// exhausted the chunk
						break;
					}
					if (sel_index < offset) {
						throw InternalException("sel_index < offset in expression filter");
					}
					current_sel.set_index(current_count++, sel_index - offset);
				}
				if (current_count == 0) {
					// no matching tuples in this chunk
					offset += chunk_count;
					continue;
				}
				auto current_result_data = result_sel.data() + result_offset;
				SelectionVector current_result_sel(current_result_data);
				idx_t new_matches =
				    state.executor.SelectExpression(chunk, current_result_sel, current_sel, current_count);
				// increment all matches by the offset
				for (idx_t i = 0; i < new_matches; i++) {
					current_result_data[i] += offset;
				}
				result_offset += new_matches;
				offset += chunk_count;
			}
			approved_tuple_count = result_offset;
		} else {
			// standard case: we can handle everything at once - run the expression once
			DataChunk chunk;
			chunk.data.emplace_back(vector);
			chunk.SetCardinality(scan_count);
			approved_tuple_count = state.executor.SelectExpression(chunk, result_sel, sel, approved_tuple_count);
		}
		sel.Initialize(result_sel);
		return approved_tuple_count;
	}
	default:
		throw InternalException("FIXME: unsupported type for filter selection");
	}
}